

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O2

void mod2sparse_copycols(mod2sparse *m,mod2sparse *r,int *cols)

{
  int iVar1;
  mod2entry *pmVar2;
  char *__ptr;
  long lVar3;
  size_t sStack_30;
  
  if (r->n_rows < m->n_rows) {
    __ptr = "mod2sparse_copycols: Destination matrix has fewer rows than source\n";
    sStack_30 = 0x43;
  }
  else {
    mod2sparse_clear(r);
    lVar3 = 0;
    while( true ) {
      if (r->n_cols <= lVar3) {
        return;
      }
      iVar1 = cols[lVar3];
      if (((long)iVar1 < 0) || (m->n_cols <= iVar1)) break;
      pmVar2 = m->cols + iVar1;
      while( true ) {
        pmVar2 = pmVar2->down;
        if (pmVar2->row < 0) break;
        mod2sparse_insert(r,pmVar2->row,(int)lVar3);
      }
      lVar3 = lVar3 + 1;
    }
    __ptr = "mod2sparse_copycols: Column index out of range\n";
    sStack_30 = 0x2f;
  }
  fwrite(__ptr,sStack_30,1,_stderr);
  exit(1);
}

Assistant:

void mod2sparse_copycols
( mod2sparse *m,	/* Matrix to copy */
  mod2sparse *r,	/* Place to store copy of matrix */
  int *cols		/* Indexes of columns to copy, from 0 */
)
{ 
  mod2entry *e;
  int j;

  if (mod2sparse_rows(m)>mod2sparse_rows(r))
  { fprintf(stderr,
      "mod2sparse_copycols: Destination matrix has fewer rows than source\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (j = 0; j<mod2sparse_cols(r); j++)
  { if (cols[j]<0 || cols[j]>=mod2sparse_cols(m))
    { fprintf(stderr,"mod2sparse_copycols: Column index out of range\n");
      exit(1);
    }
    e = mod2sparse_first_in_col(m,cols[j]);
    while (!mod2sparse_at_end(e))
    { mod2sparse_insert(r,e->row,j);
      e = mod2sparse_next_in_col(e);
    }
  }
}